

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

bool MatchLabelsAgainstFilterRE
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *labels,vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                        *expressions)

{
  RegularExpression *pRVar1;
  pointer pbVar2;
  bool bVar3;
  RegularExpression *re;
  RegularExpression *this;
  string *l;
  pointer pbVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  RegularExpressionMatch match;
  RegularExpressionMatch RStack_238;
  
  pRVar1 = (expressions->
           super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (this = (expressions->
              super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
              )._M_impl.super__Vector_impl_data._M_start; this != pRVar1; this = this + 1) {
    memset(&RStack_238,0,0x208);
    pbVar4 = (labels->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (labels->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (pbVar4 == pbVar2) goto LAB_001dc565;
      bVar3 = cmsys::RegularExpression::find(this,(pbVar4->_M_dataplus)._M_p,&RStack_238);
      pbVar4 = pbVar4 + 1;
    } while (!bVar3);
  }
LAB_001dc565:
  return this == pRVar1;
}

Assistant:

static bool MatchLabelsAgainstFilterRE(
  const std::vector<std::string>& labels,
  const std::vector<cmsys::RegularExpression>& expressions)
{
  for (const auto& re : expressions) {
    // check to see if the label regular expression matches
    bool found = false; // assume it does not match
    cmsys::RegularExpressionMatch match;
    // loop over all labels and look for match
    for (std::string const& l : labels) {
      if (re.find(l.c_str(), match)) {
        found = true;
        break;
      }
    }
    // if no match was found, exclude the test
    if (!found) {
      return false;
    }
  }
  return true;
}